

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O0

void __thiscall StackLattice_Join_Test::TestBody(StackLattice_Join_Test *this)

{
  initializer_list<wasm::analysis::Flat<unsigned_int>::Element> __l;
  initializer_list<wasm::analysis::Flat<unsigned_int>::Element> __l_00;
  initializer_list<wasm::analysis::Flat<unsigned_int>::Element> __l_01;
  Element *pEVar1;
  uint *val;
  uint *val_00;
  uint *val_01;
  uint *val_02;
  Flat<unsigned_int> *this_00;
  allocator<wasm::analysis::Flat<unsigned_int>::Element> local_105;
  undefined4 local_104;
  _Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
  local_100;
  undefined1 local_fc;
  undefined4 local_f8;
  undefined1 local_f4;
  _Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
  *local_f0;
  size_type local_e8;
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  local_e0;
  allocator<wasm::analysis::Flat<unsigned_int>::Element> local_c1;
  undefined4 local_c0;
  undefined4 local_bc;
  _Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
  local_b8;
  undefined1 local_b4;
  undefined4 local_b0;
  undefined1 local_ac;
  _Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
  *local_a8;
  size_type local_a0;
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  local_98;
  allocator<wasm::analysis::Flat<unsigned_int>::Element> local_6d;
  undefined4 local_6c;
  _Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
  local_68;
  undefined1 local_64;
  _Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
  *local_60;
  size_type local_58;
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  local_50;
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  local_38;
  Stack<wasm::analysis::Flat<unsigned_int>_> *local_20;
  Flat<unsigned_int> *flat;
  StackLattice_Join_Test *pSStack_10;
  Stack<wasm::analysis::Flat<unsigned_int>_> stack;
  StackLattice_Join_Test *this_local;
  
  pSStack_10 = this;
  ::wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>_>::Stack
            ((Stack<wasm::analysis::Flat<unsigned_int>_> *)((long)&flat + 7),
             (Flat<unsigned_int> *)((long)&flat + 6));
  local_38.
  super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20 = (Stack<wasm::analysis::Flat<unsigned_int>_> *)((long)&flat + 7);
  std::
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::vector(&local_38);
  local_6c = 0;
  pEVar1 = ::wasm::analysis::Flat<unsigned_int>::get
                     ((Element *)local_20,(Flat<unsigned_int> *)&local_6c,val);
  local_68 = SUB84(pEVar1,0);
  local_64 = (undefined1)((ulong)pEVar1 >> 0x20);
  local_60 = &local_68;
  local_58 = 1;
  std::allocator<wasm::analysis::Flat<unsigned_int>::Element>::allocator(&local_6d);
  __l_01._M_len = local_58;
  __l_01._M_array = (iterator)local_60;
  std::
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::vector(&local_50,__l_01,&local_6d);
  local_bc = 0;
  pEVar1 = ::wasm::analysis::Flat<unsigned_int>::get
                     ((Element *)local_20,(Flat<unsigned_int> *)&local_bc,val_00);
  local_b8 = SUB84(pEVar1,0);
  local_b4 = (undefined1)((ulong)pEVar1 >> 0x20);
  local_c0 = 1;
  pEVar1 = ::wasm::analysis::Flat<unsigned_int>::get
                     ((Element *)local_20,(Flat<unsigned_int> *)&local_c0,val_01);
  local_b0 = SUB84(pEVar1,0);
  local_ac = (undefined1)((ulong)pEVar1 >> 0x20);
  local_a8 = &local_b8;
  local_a0 = 2;
  std::allocator<wasm::analysis::Flat<unsigned_int>::Element>::allocator(&local_c1);
  __l_00._M_len = local_a0;
  __l_00._M_array = (iterator)local_a8;
  std::
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::vector(&local_98,__l_00,&local_c1);
  local_104 = 0;
  this_00 = (Flat<unsigned_int> *)&local_104;
  pEVar1 = ::wasm::analysis::Flat<unsigned_int>::get((Element *)local_20,this_00,val_02);
  local_100 = SUB84(pEVar1,0);
  local_fc = (undefined1)((ulong)pEVar1 >> 0x20);
  pEVar1 = ::wasm::analysis::Flat<unsigned_int>::getTop((Element *)local_20,this_00);
  local_f8 = SUB84(pEVar1,0);
  local_f4 = (undefined1)((ulong)pEVar1 >> 0x20);
  local_f0 = &local_100;
  local_e8 = 2;
  std::allocator<wasm::analysis::Flat<unsigned_int>::Element>::allocator(&local_105);
  __l._M_len = local_e8;
  __l._M_array = (iterator)local_f0;
  std::
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::vector(&local_e0,__l,&local_105);
  testDiamondJoin<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>
            ((Stack<wasm::analysis::Flat<unsigned_int>_> *)((long)&flat + 7),&local_38,&local_50,
             &local_98,&local_e0);
  std::
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::~vector(&local_e0);
  std::allocator<wasm::analysis::Flat<unsigned_int>::Element>::~allocator(&local_105);
  std::
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::~vector(&local_98);
  std::allocator<wasm::analysis::Flat<unsigned_int>::Element>::~allocator(&local_c1);
  std::
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::~vector(&local_50);
  std::allocator<wasm::analysis::Flat<unsigned_int>::Element>::~allocator(&local_6d);
  std::
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::~vector(&local_38);
  return;
}

Assistant:

TEST(StackLattice, Join) {
  analysis::Stack stack{analysis::Flat<uint32_t>{}};
  auto& flat = stack.lattice;
  testDiamondJoin(stack,
                  {},
                  {flat.get(0)},
                  {flat.get(0), flat.get(1)},
                  {flat.get(0), flat.getTop()});
}